

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O0

void QUnicodeTools::Tailored::tibetanAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  long lVar1;
  qsizetype qVar2;
  long in_RCX;
  long in_RDX;
  char16_t *in_RSI;
  long in_R8;
  long in_FS_OFFSET;
  qsizetype boundary;
  qsizetype i;
  qsizetype end;
  bool invalid;
  long local_48;
  long local_40;
  bool local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  lVar1 = in_RDX + in_R8;
  while (local_40 < in_RCX) {
    local_9 = true;
    qVar2 = tibetan_nextSyllableBoundary(in_RSI,in_RDX + local_40,in_RDX + in_RCX,&local_9);
    local_48 = qVar2 - in_RDX;
    *(byte *)(lVar1 + local_40) = *(byte *)(lVar1 + local_40) & 0xfe | 1;
    if (in_RCX + -1 < local_48) {
      local_48 = in_RCX;
    }
    while (local_40 = local_40 + 1, local_40 < local_48) {
      *(byte *)(lVar1 + local_40) = *(byte *)(lVar1 + local_40) & 0xfe;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void tibetanAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
        bool invalid;
        qsizetype boundary = tibetan_nextSyllableBoundary(text, from+i, end, &invalid) - from;

        attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }
}